

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::
     Contains<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *local_30;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail_local;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list_local;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                         (local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }